

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O2

__pid_t __thiscall crnlib::semaphore::wait(semaphore *this,void *__stat_loc)

{
  uint uVar1;
  int *piVar2;
  int *extraout_RAX;
  timespec interval;
  timespec local_18;
  
  if ((int)__stat_loc == -1) {
    uVar1 = sem_wait((sem_t *)this->m_sem);
  }
  else {
    local_18.tv_sec = ((ulong)__stat_loc & 0xffffffff) / 1000;
    local_18.tv_nsec = (long)(uint)((int)(((ulong)__stat_loc & 0xffffffff) % 1000) * 1000000);
    uVar1 = sem_timedwait((sem_t *)this->m_sem,&local_18);
  }
  piVar2 = (int *)(ulong)uVar1;
  if (uVar1 != 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x6e) {
      crnlib_fail("\"semaphore: sem_wait() or sem_timedwait() failed\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_threading_pthreads.cpp"
                  ,0xbb);
      piVar2 = extraout_RAX;
    }
  }
  return (__pid_t)CONCAT71((int7)((ulong)piVar2 >> 8),uVar1 == 0);
}

Assistant:

bool semaphore::wait(uint32 milliseconds) {
  int status;
  if (milliseconds == cUINT32_MAX) {
    status = sem_wait(m_sem);
  } else {
#if !defined(__APPLE__)
    struct timespec interval;
    interval.tv_sec = milliseconds / 1000;
    interval.tv_nsec = (milliseconds % 1000) * 1000000L;
    status = sem_timedwait(m_sem, &interval);
#else
    status = sem_wait(m_sem);
#endif
  }

  if (status) {
    if (errno != ETIMEDOUT) {
      CRNLIB_FAIL("semaphore: sem_wait() or sem_timedwait() failed");
    }
    return false;
  }

  return true;
}